

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O2

string * __thiscall
RigidBodyDynamics::Utils::get_dof_name_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,SpatialVector *joint_dof)

{
  bool bVar1;
  ostream *poVar2;
  char *__s;
  Utils *local_1a0;
  ostringstream dof_stream;
  
  _dof_stream = 0x3ff0000000000000;
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                    ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)this,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&dof_stream);
  if (bVar1) {
    __s = "RX";
  }
  else {
    _dof_stream = 0;
    bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                      ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)this,
                       (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&dof_stream);
    if (bVar1) {
      __s = "RY";
    }
    else {
      _dof_stream = 0;
      bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                        ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)this,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&dof_stream);
      if (bVar1) {
        __s = "RZ";
      }
      else {
        _dof_stream = 0;
        bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                          ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)this,
                           (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&dof_stream);
        if (bVar1) {
          __s = "TX";
        }
        else {
          _dof_stream = 0;
          bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                            ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)this,
                             (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&dof_stream);
          if (bVar1) {
            __s = "TY";
          }
          else {
            _dof_stream = 0;
            bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                              ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)this,
                               (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&dof_stream);
            if (!bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&dof_stream,_S_out);
              poVar2 = std::operator<<((ostream *)&dof_stream,"custom (");
              local_1a0 = this;
              poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                                 *)&local_1a0);
              std::operator<<(poVar2,")");
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dof_stream);
              return __return_storage_ptr__;
            }
            __s = "TZ";
          }
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&dof_stream);
  return __return_storage_ptr__;
}

Assistant:

string get_dof_name (const SpatialVector &joint_dof) {
	if (joint_dof == SpatialVector (1., 0., 0., 0., 0., 0.)) 
		return "RX";
	else if (joint_dof == SpatialVector (0., 1., 0., 0., 0., 0.))
		return "RY";
	else if (joint_dof == SpatialVector (0., 0., 1., 0., 0., 0.))
		return "RZ";
	else if (joint_dof == SpatialVector (0., 0., 0., 1., 0., 0.))
		return "TX";
	else if (joint_dof == SpatialVector (0., 0., 0., 0., 1., 0.))
		return "TY";
	else if (joint_dof == SpatialVector (0., 0., 0., 0., 0., 1.))
		return "TZ";

	ostringstream dof_stream(ostringstream::out);
	dof_stream << "custom (" << joint_dof.transpose() << ")";
	return dof_stream.str();
}